

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigOper.c
# Opt level: O3

Aig_Obj_t * Aig_And(Aig_Man_t *p,Aig_Obj_t *p0,Aig_Obj_t *p1)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  bool bVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  Aig_Obj_t *pAVar8;
  Aig_Obj_t *pAVar9;
  uint uVar10;
  uint uVar11;
  Aig_Obj_t *pAVar12;
  Aig_Obj_t *pAVar13;
  
  pAVar6 = p0;
  if (p0 != p1) {
    do {
      pAVar12 = (Aig_Obj_t *)((ulong)p1 ^ 1);
      if (pAVar6 == pAVar12) {
        pAVar7 = p->pConst1;
        goto LAB_00608740;
      }
      pAVar8 = (Aig_Obj_t *)((ulong)pAVar6 & 0xfffffffffffffffe);
      pAVar1 = p->pConst1;
      if (pAVar1 == pAVar8) {
        if (pAVar6 == pAVar8) {
          return p1;
        }
        return (Aig_Obj_t *)((ulong)pAVar6 | 1);
      }
      pAVar9 = (Aig_Obj_t *)((ulong)p1 & 0xfffffffffffffffe);
      if (pAVar1 == pAVar9) {
        if (pAVar1 == p1) {
          return pAVar6;
        }
        goto LAB_0060876d;
      }
      if ((p->fAddStrash == 0) ||
         (((*(uint *)&pAVar8->field_0x18 & 7) - 7 < 0xfffffffe &&
          ((*(uint *)&pAVar9->field_0x18 & 7) - 7 < 0xfffffffe)))) goto LAB_0060866f;
      pAVar2 = pAVar8->pFanin0;
      pAVar7 = pAVar8->pFanin1;
      pAVar3 = pAVar9->pFanin0;
      pAVar4 = pAVar9->pFanin1;
      if (((ulong)pAVar6 & 1) == 0) {
        if (pAVar7 == pAVar12 || pAVar2 == pAVar12) goto LAB_0060876d;
        if (pAVar2 == p1) {
          return pAVar6;
        }
        if (pAVar7 == p1) {
          return pAVar6;
        }
LAB_006084b9:
        bVar5 = pAVar4 == (Aig_Obj_t *)((ulong)pAVar6 ^ 1) ||
                pAVar3 == (Aig_Obj_t *)((ulong)pAVar6 ^ 1);
        pAVar12 = pAVar4;
        if (((ulong)p1 & 1) == 0) {
          if (bVar5) {
LAB_0060876d:
            return (Aig_Obj_t *)((ulong)pAVar1 ^ 1);
          }
          if (pAVar3 == pAVar6) {
            return p1;
          }
          if (pAVar4 == pAVar6) {
            return p1;
          }
          pAVar13 = (Aig_Obj_t *)((ulong)pAVar3 ^ 1);
          if (((ulong)pAVar6 & 1) == 0) {
            if ((((pAVar2 == pAVar13) || (pAVar2 == (Aig_Obj_t *)((ulong)pAVar4 ^ 1))) ||
                (pAVar7 == pAVar13)) || (pAVar7 == (Aig_Obj_t *)((ulong)pAVar4 ^ 1)))
            goto LAB_0060876d;
            p0 = pAVar6;
            if (((pAVar2 != pAVar3) && (pAVar7 != pAVar3)) &&
               ((p0 = pAVar2, pAVar12 = p1, pAVar7 != pAVar4 &&
                (p0 = pAVar6, pAVar12 = pAVar3, pAVar2 != pAVar4)))) {
LAB_0060866f:
              uVar11 = (uint)pAVar6 & 1;
              goto LAB_00608676;
            }
          }
          else {
            if (pAVar2 == pAVar13) {
              return p1;
            }
            if (pAVar2 == (Aig_Obj_t *)((ulong)pAVar4 ^ 1)) {
              return p1;
            }
            if (pAVar7 == pAVar13) {
              return p1;
            }
            if (pAVar7 == (Aig_Obj_t *)((ulong)pAVar4 ^ 1)) {
              return p1;
            }
            pAVar12 = p1;
            if ((pAVar7 == pAVar3) || (pAVar7 == pAVar4)) goto LAB_006085e0;
            if ((pAVar2 != pAVar3) && (pAVar2 != pAVar4)) goto LAB_0060866f;
            p0 = (Aig_Obj_t *)((ulong)pAVar7 ^ 1);
          }
        }
        else {
          if (bVar5) {
            return pAVar6;
          }
          if (pAVar4 == pAVar6) {
            p0 = (Aig_Obj_t *)((ulong)pAVar3 ^ 1);
          }
          else if (pAVar3 == pAVar6) {
            p0 = (Aig_Obj_t *)((ulong)pAVar4 ^ 1);
            pAVar12 = pAVar3;
          }
          else {
            if (((ulong)pAVar6 & 1) != 0) {
              if ((pAVar2 == pAVar4) && (pAVar7 == (Aig_Obj_t *)((ulong)pAVar3 ^ 1))) {
LAB_006087d3:
                return (Aig_Obj_t *)((ulong)pAVar2 ^ 1);
              }
              if ((pAVar7 == pAVar3) && (pAVar2 == (Aig_Obj_t *)((ulong)pAVar4 ^ 1))) {
LAB_00608740:
                return (Aig_Obj_t *)((ulong)pAVar7 ^ 1);
              }
              if ((pAVar2 == pAVar3) && (pAVar7 == (Aig_Obj_t *)((ulong)pAVar4 ^ 1)))
              goto LAB_006087d3;
              uVar11 = 1;
              if ((pAVar7 == pAVar4) && (pAVar2 == (Aig_Obj_t *)((ulong)pAVar3 ^ 1)))
              goto LAB_00608740;
LAB_00608676:
              uVar10 = (uint)*(undefined8 *)&pAVar8->field_0x18;
              if ((((uVar11 & (uint)p1) != 0) && (p->fCatchExor != 0)) &&
                 (((uVar10 & 7) == 5 && ((*(uint *)&pAVar9->field_0x18 & 7) == 5)))) {
                pAVar12 = pAVar8->pFanin0;
                if (((ulong)pAVar9->pFanin0 ^ (ulong)pAVar12) < 2) {
                  pAVar7 = pAVar8->pFanin1;
                  if (((pAVar9->pFanin1 != pAVar7) && (pAVar9->pFanin0 != pAVar12)) &&
                     (((ulong)pAVar9->pFanin1 ^ (ulong)pAVar7) < 2)) {
                    pAVar6 = Aig_Exor(p,pAVar12,pAVar7);
                    return pAVar6;
                  }
                }
              }
              if ((uVar10 & 7) == 1) {
                __assert_fail("Type != AIG_OBJ_AND || !Aig_ObjIsConst1(Aig_Regular(p0))",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                              ,0x15d,
                              "Aig_Obj_t *Aig_ObjCreateGhost(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Type_t)"
                             );
              }
              if (p1 == (Aig_Obj_t *)0x0) {
                if (pAVar8 == (Aig_Obj_t *)0x0) goto LAB_0060883a;
                *(ulong *)&(p->Ghost).field_0x18 =
                     *(ulong *)&(p->Ghost).field_0x18 & 0xfffffffffffffff8 | 5;
                pAVar12 = (Aig_Obj_t *)0x0;
                p1 = pAVar6;
              }
              else {
                if ((*(uint *)&pAVar9->field_0x18 & 7) == 1) {
                  __assert_fail("p1 == NULL || !Aig_ObjIsConst1(Aig_Regular(p1))",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                                ,0x15e,
                                "Aig_Obj_t *Aig_ObjCreateGhost(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Type_t)"
                               );
                }
                if (pAVar8 == pAVar9) {
LAB_0060883a:
                  __assert_fail("Type == AIG_OBJ_CI || Aig_Regular(p0) != Aig_Regular(p1)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                                ,0x15f,
                                "Aig_Obj_t *Aig_ObjCreateGhost(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Type_t)"
                               );
                }
                *(ulong *)&(p->Ghost).field_0x18 =
                     *(ulong *)&(p->Ghost).field_0x18 & 0xfffffffffffffff8 | 5;
                pAVar12 = pAVar6;
                if (pAVar8->Id < pAVar9->Id) {
                  pAVar12 = p1;
                  p1 = pAVar6;
                }
              }
              (p->Ghost).pFanin0 = p1;
              (p->Ghost).pFanin1 = pAVar12;
              pAVar6 = Aig_TableLookup(p,&p->Ghost);
              if (pAVar6 != (Aig_Obj_t *)0x0) {
                return pAVar6;
              }
              pAVar6 = Aig_ObjCreate(p,&p->Ghost);
              return pAVar6;
            }
            if (pAVar3 == (Aig_Obj_t *)((ulong)pAVar2 ^ 1)) {
              return pAVar6;
            }
            if (pAVar3 == (Aig_Obj_t *)((ulong)pAVar7 ^ 1)) {
              return pAVar6;
            }
            if (pAVar4 == (Aig_Obj_t *)((ulong)pAVar2 ^ 1)) {
              return pAVar6;
            }
            if (pAVar4 == (Aig_Obj_t *)((ulong)pAVar7 ^ 1)) {
              return pAVar6;
            }
            pAVar12 = pAVar3;
            if ((((pAVar4 != pAVar2) && (pAVar4 != pAVar7)) && (pAVar12 = pAVar4, pAVar3 != pAVar2))
               && (pAVar3 != pAVar7)) goto LAB_0060866f;
            p0 = (Aig_Obj_t *)((ulong)pAVar12 ^ 1);
            pAVar12 = pAVar6;
          }
        }
      }
      else {
        if (pAVar7 == pAVar12 || pAVar2 == pAVar12) {
          return p1;
        }
        pAVar12 = pAVar7;
        if (pAVar7 == p1) {
LAB_006085e0:
          p0 = (Aig_Obj_t *)((ulong)pAVar2 ^ 1);
        }
        else {
          if (pAVar2 != p1) goto LAB_006084b9;
          p0 = (Aig_Obj_t *)((ulong)pAVar7 ^ 1);
          pAVar12 = pAVar2;
        }
      }
      p1 = pAVar12;
      pAVar6 = p0;
    } while (p0 != pAVar12);
  }
  return p0;
}

Assistant:

Aig_Obj_t * Aig_And( Aig_Man_t * p, Aig_Obj_t * p0, Aig_Obj_t * p1 )
{
    Aig_Obj_t * pGhost, * pResult;
    Aig_Obj_t * pFan0, * pFan1;
    // check trivial cases
    if ( p0 == p1 )
        return p0;
    if ( p0 == Aig_Not(p1) )
        return Aig_Not(p->pConst1);
    if ( Aig_Regular(p0) == p->pConst1 )
        return p0 == p->pConst1 ? p1 : Aig_Not(p->pConst1);
    if ( Aig_Regular(p1) == p->pConst1 )
        return p1 == p->pConst1 ? p0 : Aig_Not(p->pConst1);
    // check not so trivial cases
    if ( p->fAddStrash && (Aig_ObjIsNode(Aig_Regular(p0)) || Aig_ObjIsNode(Aig_Regular(p1))) )
    { // http://fmv.jku.at/papers/BrummayerBiere-MEMICS06.pdf
        Aig_Obj_t * pFanA, * pFanB, * pFanC, * pFanD;
        pFanA = Aig_ObjChild0(Aig_Regular(p0));
        pFanB = Aig_ObjChild1(Aig_Regular(p0));
        pFanC = Aig_ObjChild0(Aig_Regular(p1));
        pFanD = Aig_ObjChild1(Aig_Regular(p1));
        if ( Aig_IsComplement(p0) )
        {
            if ( pFanA == Aig_Not(p1) || pFanB == Aig_Not(p1) )
                return p1;
            if ( pFanB == p1 )
                return Aig_And( p, Aig_Not(pFanA), pFanB );
            if ( pFanA == p1 )
                return Aig_And( p, Aig_Not(pFanB), pFanA );
        }
        else
        {
            if ( pFanA == Aig_Not(p1) || pFanB == Aig_Not(p1) )
                return Aig_Not(p->pConst1);
            if ( pFanA == p1 || pFanB == p1 )
                return p0;
        }
        if ( Aig_IsComplement(p1) )
        {
            if ( pFanC == Aig_Not(p0) || pFanD == Aig_Not(p0) )
                return p0;
            if ( pFanD == p0 )
                return Aig_And( p, Aig_Not(pFanC), pFanD );
            if ( pFanC == p0 )
                return Aig_And( p, Aig_Not(pFanD), pFanC );
        }
        else
        {
            if ( pFanC == Aig_Not(p0) || pFanD == Aig_Not(p0) )
                return Aig_Not(p->pConst1);
            if ( pFanC == p0 || pFanD == p0 )
                return p1;
        }
        if ( !Aig_IsComplement(p0) && !Aig_IsComplement(p1) ) 
        {
            if ( pFanA == Aig_Not(pFanC) || pFanA == Aig_Not(pFanD) || pFanB == Aig_Not(pFanC) || pFanB == Aig_Not(pFanD) )
                return Aig_Not(p->pConst1);
            if ( pFanA == pFanC || pFanB == pFanC )
                return Aig_And( p, p0, pFanD );
            if ( pFanB == pFanC || pFanB == pFanD )
                return Aig_And( p, pFanA, p1 );
            if ( pFanA == pFanD || pFanB == pFanD )
                return Aig_And( p, p0, pFanC );
            if ( pFanA == pFanC || pFanA == pFanD )
                return Aig_And( p, pFanB, p1 );
        }
        else if ( Aig_IsComplement(p0) && !Aig_IsComplement(p1) )
        {
            if ( pFanA == Aig_Not(pFanC) || pFanA == Aig_Not(pFanD) || pFanB == Aig_Not(pFanC) || pFanB == Aig_Not(pFanD) )
                return p1;
            if ( pFanB == pFanC || pFanB == pFanD )
                return Aig_And( p, Aig_Not(pFanA), p1 );
            if ( pFanA == pFanC || pFanA == pFanD )
                return Aig_And( p, Aig_Not(pFanB), p1 );
        }
        else if ( !Aig_IsComplement(p0) && Aig_IsComplement(p1) )
        {
            if ( pFanC == Aig_Not(pFanA) || pFanC == Aig_Not(pFanB) || pFanD == Aig_Not(pFanA) || pFanD == Aig_Not(pFanB) )
                return p0;
            if ( pFanD == pFanA || pFanD == pFanB )
                return Aig_And( p, Aig_Not(pFanC), p0 );
            if ( pFanC == pFanA || pFanC == pFanB )
                return Aig_And( p, Aig_Not(pFanD), p0 );
        }
        else // if ( Aig_IsComplement(p0) && Aig_IsComplement(p1) )
        {
            if ( pFanA == pFanD && pFanB == Aig_Not(pFanC) )
                return Aig_Not(pFanA);
            if ( pFanB == pFanC && pFanA == Aig_Not(pFanD) )
                return Aig_Not(pFanB);
            if ( pFanA == pFanC && pFanB == Aig_Not(pFanD) )
                return Aig_Not(pFanA);
            if ( pFanB == pFanD && pFanA == Aig_Not(pFanC) )
                return Aig_Not(pFanB);
        }
    }
    // check if it can be an EXOR gate
    if ( p->fCatchExor && Aig_ObjIsExorType( p0, p1, &pFan0, &pFan1 ) )
        return Aig_Exor( p, pFan0, pFan1 );
    pGhost = Aig_ObjCreateGhost( p, p0, p1, AIG_OBJ_AND );
    if ( (pResult = Aig_TableLookup( p, pGhost )) )
        return pResult;
    return Aig_ObjCreate( p, pGhost );
}